

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Utility.cpp
# Opt level: O0

void __thiscall
UtilityTest_Unpack32Test_Test::~UtilityTest_Unpack32Test_Test(UtilityTest_Unpack32Test_Test *this)

{
  UtilityTest_Unpack32Test_Test *this_local;
  
  ~UtilityTest_Unpack32Test_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(UtilityTest, Unpack32Test) {
    // Test case 1: Unpacking four bytes from a single byte array
    uint8_t data1[] = {0xAB, 0xCD, 0xEF, 0x12};
    uint32_t result1 = Unpack32(data1, 0);
    EXPECT_EQ(result1, 0xABCDEF12);

    // Test case 2: Unpacking four bytes at a non-zero offset
    uint8_t data2[] = {0x12, 0x34, 0x56, 0x78, 0x9A, 0xBC};
    uint32_t result2 = Unpack32(data2, 2);
    EXPECT_EQ(result2, 0x56789ABC);

    // Test case 3: Unpacking four bytes from a larger array
    uint8_t data3[] = {0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88};
    uint32_t result3 = Unpack32(data3, 4);
    EXPECT_EQ(result3, 0x55667788);
}